

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

bool __thiscall EntryUnpacker::operator()(EntryUnpacker *this,EntryKey *entryKey)

{
  VolumeFile *pVVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *f;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  NodeKey nodeKey;
  string entryPath;
  path fullEntryPath;
  NodeBTree nodeBtree;
  EntryUnpacker childUnpacker;
  path local_168;
  string local_148;
  string local_128;
  BTree<NodeBTree,_NodeKey> local_108;
  undefined1 local_100;
  undefined1 local_f8 [224];
  
  VolumeFile::getEntryPath(&local_148,this->m_volume,entryKey,&this->m_parentDirectory);
  if (local_148._M_string_length == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot determine entry path.");
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar2 = false;
    goto LAB_0011f6eb;
  }
  std::__cxx11::string::string((string *)local_f8,(string *)this->m_outDirectory);
  std::__cxx11::string::string((string *)&local_168,(string *)&local_148);
  boost::filesystem::operator/((path *)&local_128,(path *)local_f8,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)local_f8);
  if ((entryKey->m_flags & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"FILE:");
    poVar4 = std::operator<<(poVar4,(string *)&local_148);
    std::endl<char,std::char_traits<char>>(poVar4);
    pVVar1 = this->m_volume;
    local_108.m_data =
         (pVVar1->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + pVVar1->m_nodeTreeOffset;
    local_100 = 1 < (ulong)(((long)(pVVar1->m_dataStreams).
                                   super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pVVar1->m_dataStreams).
                                  super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x250);
    local_168.m_pathname._M_string_length = 0;
    local_168.m_pathname.field_2._M_allocated_capacity = 0xffffffff;
    local_168.m_pathname._M_dataplus._M_p = (pointer)((ulong)entryKey->m_linkIndex << 0x20);
    uVar3 = BTree<NodeBTree,_NodeKey>::searchByKey(&local_108,(NodeKey *)&local_168);
    if (uVar3 != 0xffffffff) {
      bVar2 = VolumeFile::unpackNode(this->m_volume,(NodeKey *)&local_168,&local_128);
      if (bVar2) goto LAB_0011f6df;
    }
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
               "Cannot unpack node: %s");
    f = boost::io::detail::
        feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   &local_128);
    pbVar5 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,f);
    std::endl<char,std::char_traits<char>>(pbVar5);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
              ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    bVar2 = false;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"DIR:");
    poVar4 = std::operator<<(poVar4,(string *)&local_148);
    std::endl<char,std::char_traits<char>>(poVar4);
    boost::filesystem::create_directories((path *)&local_128);
    local_f8._0_8_ = this->m_volume;
    local_168.m_pathname._M_dataplus._M_p =
         (pointer)((((VolumeFile *)local_f8._0_8_)->m_data).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start +
                  (((VolumeFile *)local_f8._0_8_)->m_entryTreeOffsets).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[entryKey->m_linkIndex]);
    local_f8._8_8_ = this->m_outDirectory;
    std::__cxx11::string::string((string *)(local_f8 + 0x10),(string *)&local_148);
    BTree<EntryBTree,EntryKey>::traverse<EntryUnpacker_const>
              ((BTree<EntryBTree,EntryKey> *)&local_168,(EntryUnpacker *)local_f8);
    std::__cxx11::string::~string((string *)(local_f8 + 0x10));
LAB_0011f6df:
    bVar2 = true;
  }
  std::__cxx11::string::~string((string *)&local_128);
LAB_0011f6eb:
  std::__cxx11::string::~string((string *)&local_148);
  return bVar2;
}

Assistant:

bool operator ()(const EntryKey& entryKey) const
	{
		const auto entryPath = m_volume.getEntryPath(entryKey, m_parentDirectory);
		if (entryPath.empty()) {
			std::cerr << "Cannot determine entry path." << std::endl;
			return false;
		}
		
		const auto fullEntryPath = boost::filesystem::path(m_outDirectory) / entryPath;
		
		if (entryKey.isDirectory()) {
			std::cout << "DIR:" << entryPath << std::endl;
			//entryKey.dump();
			
			boost::filesystem::create_directories(fullEntryPath);
			
			const EntryBTree childEntryBtree(
				advancePointer(m_volume.data().data(), m_volume.entryTreeOffset(entryKey.linkIndex()))
			);
			const EntryUnpacker childUnpacker(m_volume, m_outDirectory, entryPath);
			childEntryBtree.traverse(childUnpacker);
		} else {
			std::cout << "FILE:" << entryPath << std::endl;
			//entryKey.dump();
			
			const NodeBTree nodeBtree(
				advancePointer(m_volume.data().data(), m_volume.nodeTreeOffset()),
				m_volume.hasMultipleVolumes()
			);
			NodeKey nodeKey(entryKey.linkIndex());
			const auto nodeIndex = nodeBtree.searchByKey(nodeKey);
			bool unpacked = false;
			if (nodeIndex != NodeBTree::INVALID_INDEX) {
				if (m_volume.unpackNode(nodeKey, fullEntryPath.string())) {
					unpacked = true;
				}
			}
			if (!unpacked) {
				std::cerr << boost::format("Cannot unpack node: %s") % fullEntryPath.string() << std::endl;
				return false;
			}
		}

		return true;
	}